

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

int Abc_ZddThresh(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddEnt *pAVar1;
  Abc_ZddObj *pAVar2;
  int iVar3;
  int True;
  uint uVar4;
  uint uVar5;
  
  iVar3 = a;
  if (1 < a) {
    if (b == 0) {
      iVar3 = 0;
    }
    else {
      pAVar1 = p->pCache;
      uVar5 = a * 0xc00005 + b * 0x40f1f9 + 0x65d2d9;
      uVar4 = p->nCacheMask & uVar5;
      p->nCacheLookups = p->nCacheLookups + 1;
      iVar3 = -1;
      if (((pAVar1[uVar4].Arg0 == a) && (pAVar1[uVar4].Arg1 == b)) && (pAVar1[uVar4].Arg2 == 9)) {
        iVar3 = pAVar1[uVar4].Res;
      }
      if (iVar3 < 0) {
        pAVar2 = p->pObjs;
        iVar3 = Abc_ZddThresh(p,pAVar2[(uint)a].False,b);
        True = Abc_ZddThresh(p,pAVar2[(uint)a].True,b + -1);
        iVar3 = Abc_ZddUniqueCreate(p,*(uint *)(pAVar2 + (uint)a) & 0x7fffffff,True,iVar3);
        pAVar1 = p->pCache;
        uVar5 = uVar5 & p->nCacheMask;
        pAVar1[uVar5].Arg0 = a;
        pAVar1[uVar5].Arg1 = b;
        pAVar1[uVar5].Arg2 = 9;
        pAVar1[uVar5].Res = iVar3;
        p->nCacheMisses = p->nCacheMisses + 1;
        if (iVar3 < 0) {
          __assert_fail("Res >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPerm.c"
                        ,0x82,"int Abc_ZddCacheInsert(Abc_ZddMan *, int, int, int, int)");
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Abc_ZddThresh( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A; 
    int r0, r1, r;
    if ( a < 2 )  return a;
    if ( b == 0 ) return 0;
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_THRESH)) >= 0 )
        return r;
    A  = Abc_ZddNode( p, a );
    r0 = Abc_ZddThresh( p, A->False, b ),
    r1 = Abc_ZddThresh( p, A->True, b-1 );
    r  = Abc_ZddUniqueCreate( p, A->Var, r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_THRESH, r );
}